

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::listen_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,listen_failed_alert *this)

{
  undefined8 uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  string local_168;
  char local_148 [8];
  char ret [300];
  listen_failed_alert *this_local;
  
  unique0x10000197 = this;
  print_endpoint_abi_cxx11_
            (&local_168,(libtorrent *)&this->address,(address *)(ulong)(uint)this->port,
             (int)local_148);
  uVar1 = std::__cxx11::string::c_str();
  pcVar2 = listen_interface(this);
  pcVar3 = operation_name(this->op);
  pcVar4 = anon_unknown_62::sock_type_str(this->socket_type);
  boost::system::error_code::message_abi_cxx11_(&local_1b8,&this->error);
  convert_from_native(&local_198,&local_1b8);
  uVar5 = std::__cxx11::string::c_str();
  snprintf(local_148,300,"listening on %s (device: %s) failed: [%s] [%s] %s",uVar1,pcVar2,pcVar3,
           pcVar4,uVar5);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_148,&local_1b9);
  std::allocator<char>::~allocator(&local_1b9);
  return __return_storage_ptr__;
}

Assistant:

std::string listen_failed_alert::message() const
	{
		char ret[300];
		std::snprintf(ret, sizeof(ret), "listening on %s (device: %s) failed: [%s] [%s] %s"
			, print_endpoint(address, port).c_str()
			, listen_interface()
			, operation_name(op)
			, sock_type_str(socket_type)
			, convert_from_native(error.message()).c_str());
		return ret;
	}